

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O2

s32 __thiscall irr::gui::CGUIEditBox::getCursorPos(CGUIEditBox *this,s32 x,s32 y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  
  plVar5 = (long *)(**(code **)(*(long *)this + 0x130))();
  if ((this->WordWrap == false) && (this->MultiLine != true)) {
    iVar6 = 1;
  }
  else {
    iVar6 = (int)((ulong)((long)(this->BrokenText).m_data.
                                super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->BrokenText).m_data.
                               super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
  }
  lVar7 = 0;
  lVar8 = 0;
  while( true ) {
    iVar4 = (int)lVar8;
    if (iVar4 == iVar6) {
      return 0;
    }
    setTextRect(this,iVar4);
    iVar1 = (this->CurrentTextRect).UpperLeftCorner.Y;
    iVar3 = iVar1;
    if (iVar1 < y) {
      iVar3 = y;
    }
    iVar2 = (this->CurrentTextRect).LowerRightCorner.Y;
    if (iVar4 != 0) {
      iVar3 = y;
    }
    y = iVar2;
    if (iVar3 < iVar2) {
      y = iVar3;
    }
    if (iVar4 - iVar6 != -1) {
      y = iVar3;
    }
    if (y <= iVar2 && iVar1 <= y) break;
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + -0x20;
  }
  if (this->WordWrap == true) {
    puVar9 = (undefined8 *)
             ((long)(this->BrokenText).m_data.
                    super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - lVar7);
  }
  else {
    if (this->MultiLine != true) {
      puVar9 = (undefined8 *)&this->field_0xa8;
      iVar6 = 0;
      goto LAB_0022add2;
    }
    puVar9 = (undefined8 *)
             ((long)(this->BrokenText).m_data.
                    super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - lVar7);
  }
  iVar6 = (this->BrokenTextPositions).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar8];
LAB_0022add2:
  if (puVar9 == (undefined8 *)0x0) {
    return 0;
  }
  iVar4 = (this->CurrentTextRect).UpperLeftCorner.X;
  iVar1 = x + 3;
  if (x + 3 <= iVar4) {
    iVar1 = iVar4;
  }
  iVar4 = (**(code **)(*plVar5 + 0x10))(plVar5,*puVar9,iVar1 - iVar4);
  if (iVar4 == -1) {
    iVar4 = *(int *)(puVar9 + 1);
  }
  return iVar4 + iVar6;
}

Assistant:

s32 CGUIEditBox::getCursorPos(s32 x, s32 y)
{
	IGUIFont *font = getActiveFont();

	const u32 lineCount = (WordWrap || MultiLine) ? BrokenText.size() : 1;

	core::stringw *txtLine = 0;
	s32 startPos = 0;
	x += 3;

	for (u32 i = 0; i < lineCount; ++i) {
		setTextRect(i);
		if (i == 0 && y < CurrentTextRect.UpperLeftCorner.Y)
			y = CurrentTextRect.UpperLeftCorner.Y;
		if (i == lineCount - 1 && y > CurrentTextRect.LowerRightCorner.Y)
			y = CurrentTextRect.LowerRightCorner.Y;

		// is it inside this region?
		if (y >= CurrentTextRect.UpperLeftCorner.Y && y <= CurrentTextRect.LowerRightCorner.Y) {
			// we've found the clicked line
			txtLine = (WordWrap || MultiLine) ? &BrokenText[i] : &Text;
			startPos = (WordWrap || MultiLine) ? BrokenTextPositions[i] : 0;
			break;
		}
	}

	if (x < CurrentTextRect.UpperLeftCorner.X)
		x = CurrentTextRect.UpperLeftCorner.X;

	if (!txtLine)
		return 0;

	s32 idx = font->getCharacterFromPos(txtLine->c_str(), x - CurrentTextRect.UpperLeftCorner.X);

	// click was on or left of the line
	if (idx != -1)
		return idx + startPos;

	// click was off the right edge of the line, go to end.
	return txtLine->size() + startPos;
}